

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall icu_63::MessagePattern::MessagePattern(MessagePattern *this,UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  MessagePattern *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_004afe60;
  this->aposMode = UMSGPAT_APOS_DOUBLE_OPTIONAL;
  UnicodeString::UnicodeString(&this->msg);
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  this->hasArgNames = '\0';
  this->hasArgNumbers = '\0';
  this->needsAutoQuoting = '\0';
  init(this,(EVP_PKEY_CTX *)errorCode);
  return;
}

Assistant:

MessagePattern::MessagePattern(UErrorCode &errorCode)
        : aposMode(UCONFIG_MSGPAT_DEFAULT_APOSTROPHE_MODE),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(FALSE), hasArgNumbers(FALSE), needsAutoQuoting(FALSE) {
    init(errorCode);
}